

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O1

void Js::JavascriptBigInt::SubAbsolute(JavascriptBigInt *pbi1,JavascriptBigInt *pbi2)

{
  ulong *puVar1;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  undefined4 *puVar7;
  ulong uVar8;
  Type TVar9;
  ulong uVar10;
  ulong uVar11;
  unsigned_long uVar12;
  bool bVar13;
  
  iVar6 = CompareAbsolute(pbi1,pbi2);
  if (iVar6 != 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x1e6,"(pbi1->CompareAbsolute(pbi2) == 1)",
                                "pbi1->CompareAbsolute(pbi2) == 1");
    if (!bVar5) goto LAB_00d320ef;
    *puVar7 = 0;
  }
  puVar2 = (pbi1->m_digits).ptr;
  if (pbi2->m_length == 0) {
    uVar10 = 0;
    uVar8 = 0;
  }
  else {
    puVar3 = (pbi2->m_digits).ptr;
    uVar8 = 0;
    uVar10 = 0;
    do {
      uVar11 = puVar2[uVar8];
      puVar1 = puVar3 + uVar8;
      bVar5 = uVar11 < *puVar1;
      uVar11 = uVar11 - *puVar1;
      bVar13 = uVar10 <= uVar11;
      uVar12 = uVar11 - uVar10;
      uVar10 = (ulong)bVar5 + 1;
      if (bVar13) {
        uVar10 = (ulong)bVar5;
      }
      puVar2[uVar8] = uVar12;
      uVar8 = uVar8 + 1;
    } while (uVar8 < pbi2->m_length);
  }
  if ((uVar8 < pbi1->m_length) && (uVar10 != 0)) {
    do {
      puVar1 = puVar2 + uVar8;
      bVar5 = *puVar1 < uVar10;
      *puVar1 = *puVar1 - uVar10;
      if (pbi1->m_length <= uVar8 + 1) break;
      uVar10 = (ulong)bVar5;
      uVar8 = uVar8 + 1;
    } while (bVar5);
  }
  TVar9 = pbi1->m_length;
  bVar5 = TVar9 == 0;
  if (!bVar5) {
    if (puVar2[TVar9 - 1] == 0) {
      TVar9 = TVar9 - 1;
      do {
        pbi1->m_length = TVar9;
        bVar5 = TVar9 == 0;
        TVar9 = TVar9 - 1;
        if (bVar5) goto LAB_00d32094;
      } while (puVar2[TVar9] == 0);
    }
    if (!bVar5) {
      return;
    }
  }
LAB_00d32094:
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar7 = 1;
  bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                              ,0x1ff,"(pbi1->m_length > 0)","pbi1->m_length > 0");
  if (bVar5) {
    *puVar7 = 0;
    return;
  }
LAB_00d320ef:
  pcVar4 = (code *)invalidInstructionException();
  (*pcVar4)();
}

Assistant:

void JavascriptBigInt::SubAbsolute(JavascriptBigInt * pbi1, JavascriptBigInt * pbi2)
    {
        Assert(pbi1->CompareAbsolute(pbi2) == 1);
        digit_t carryDigit = 0;
        digit_t *pDigit1 = pbi1->m_digits;
        digit_t *pDigit2 = pbi2->m_digits;
        digit_t i = 0;

        for (; i < pbi2->m_length; i++)
        {
            digit_t tempCarryDigit = 0;
            pDigit1[i] = JavascriptBigInt::SubDigit(pDigit1[i], pDigit2[i], &tempCarryDigit);
            pDigit1[i] = JavascriptBigInt::SubDigit(pDigit1[i], carryDigit, &tempCarryDigit);
            carryDigit = tempCarryDigit;
        }

        for (; i < pbi1->m_length && carryDigit > 0; i++)
        {
            digit_t tempCarryDigit = 0;
            pDigit1[i] = JavascriptBigInt::SubDigit(pDigit1[i], carryDigit, &tempCarryDigit);
            carryDigit = tempCarryDigit;
        }
        // adjust length
        while ((pbi1->m_length>0) && (pbi1->m_digits[pbi1->m_length-1] == 0))
        {
            pbi1->m_length--;
        }
        Assert(pbi1->m_length > 0);
    }